

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O1

obj * tt_oname(obj *otmp)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  toptenentry *__ptr;
  obj *body;
  short sVar5;
  ulong uVar6;
  char **ppcVar7;
  
  if (otmp == (obj *)0x0) {
    body = (obj *)0x0;
  }
  else {
    iVar3 = open_datafile("record",0,2);
    __ptr = read_topten(iVar3,100);
    close(iVar3);
    uVar4 = mt_random();
    uVar6 = (ulong)(uVar4 % 100);
    while( true ) {
      if (0 < __ptr[uVar6].points) break;
      if (((int)uVar6 == 0) || (__ptr[uVar6].deathlev != 0)) {
        if ((__ptr[uVar6].points < 1) && (__ptr[uVar6].deathlev == 0)) {
          body = (obj *)0x0;
          goto LAB_0025f82c;
        }
        break;
      }
      uVar4 = mt_random();
      uVar6 = (ulong)uVar4 % uVar6;
    }
    if (otmp->otyp == 0x10e) {
      obj_stop_timers(otmp);
    }
    cVar2 = __ptr[uVar6].plgend[0];
    ppcVar7 = &roles[0].filecode;
    do {
      iVar3 = strncmp(__ptr[uVar6].plrole,*ppcVar7,3);
      if (iVar3 == 0) {
        if ((cVar2 != 'F') || (iVar3 = (int)*(short *)((long)ppcVar7 + 0x1a), iVar3 == -1)) {
          sVar5 = 0x10b;
          if ((short)*(undefined4 *)(ppcVar7 + 3) != -1) {
            sVar5 = (short)*(undefined4 *)(ppcVar7 + 3);
          }
          iVar3 = (int)sVar5;
        }
        goto LAB_0025f7fa;
      }
      plVar1 = (long *)(ppcVar7 + 0xc);
      ppcVar7 = ppcVar7 + 0x23;
    } while (*plVar1 != 0);
    warning("What weird role is this? (%s)",__ptr[uVar6].plrole);
    iVar3 = 0xc6;
LAB_0025f7fa:
    otmp->corpsenm = iVar3;
    uVar4 = weight(otmp);
    otmp->owt = uVar4;
    body = oname(otmp,__ptr[uVar6].name);
    if (body->otyp == 0x10e) {
      start_corpse_timeout(body);
    }
LAB_0025f82c:
    free(__ptr);
  }
  return body;
}

Assistant:

struct obj *tt_oname(struct obj *otmp)
{
    int rank, fd;
    struct toptenentry *toptenlist, *tt;

    if (!otmp)
	return NULL;

    fd = open_datafile(RECORD, O_RDONLY, SCOREPREFIX);
    toptenlist = read_topten(fd, 100); /* load the top 100 scores */
    close(fd);
    
    /* try to find a valid entry, reducing the value range for rank each time */
    rank = rn2(100);
    while (!validentry(toptenlist[rank]) && rank)
	rank = rn2(rank);
    
    tt = &toptenlist[rank];
    
    if (!validentry(toptenlist[rank]))
	otmp = NULL; /* the topten list is empty */
    else {
	/* reset timer in case corpse started out as lizard or troll */
	if (otmp->otyp == CORPSE)
	    obj_stop_timers(otmp);
	otmp->corpsenm = classmon(tt->plrole, (tt->plgend[0] == 'F'));
	otmp->owt = weight(otmp);
	otmp = oname(otmp, tt->name);
	if (otmp->otyp == CORPSE)
	    start_corpse_timeout(otmp);
    }
    
    free(toptenlist);
    return otmp;
}